

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

void * upb_Message_ResizeArrayUninitialized
                 (upb_Message *msg,upb_MiniTableField *f,size_t size,upb_Arena *arena)

{
  byte bVar1;
  uint __line;
  _Bool _Var2;
  uint32_t *puVar3;
  upb_Array *array;
  upb_Extension *puVar4;
  ulong uVar5;
  void *pvVar6;
  char *__function;
  undefined8 *from;
  char *__file;
  char *__assertion;
  ulong uStack_60;
  upb_Array *ret;
  size_t local_40;
  undefined8 local_38;
  
  _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1eb,
                  "upb_Array *upb_Message_GetOrCreateMutableArray(struct upb_Message *, const upb_MiniTableField *, upb_Arena *)"
                 );
  }
  _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
  _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
  _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
  local_38 = 0;
  if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  if ((f->presence < 0) &&
     (puVar3 = _upb_Message_OneofCasePtr_dont_copy_me__upb_internal_use_only(msg,f),
     *puVar3 != f->number_dont_copy_me__upb_internal_use_only)) {
    from = &local_38;
  }
  else {
    from = (undefined8 *)
           ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&ret,from);
  array = ret;
  if (ret == (upb_Array *)0x0) {
    bVar1 = f->descriptortype_dont_copy_me__upb_internal_use_only;
    local_40 = size;
    if ((f->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
      uStack_60 = (ulong)(bVar1 - 1);
    }
    else if (bVar1 == 5) {
      uStack_60 = 0xd;
    }
    else {
      if (bVar1 != 0xc) {
        __assertion = "0";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
        ;
        __function = "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)";
        __line = 0x7b;
        goto LAB_002b901b;
      }
      uStack_60 = 8;
    }
    bVar1 = _upb_FieldType_SizeLg2_dont_copy_me__upb_internal_use_only_size[uStack_60];
    array = (upb_Array *)upb_Arena_Malloc(arena,(4L << (bVar1 & 0x3f)) + 0x18);
    if (array != (upb_Array *)0x0) {
      array->data_dont_copy_me__upb_internal_use_only =
           (ulong)(uint)(int)(char)bVar1 - (ulong)((int)uStack_60 != 7) | (ulong)(array + 1);
      array->size_dont_copy_me__upb_internal_use_only = 0;
      array->capacity_dont_copy_me__upb_internal_use_only = 4;
    }
    _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
    size = local_40;
    ret = array;
    if ((f->mode_dont_copy_me__upb_internal_use_only & 8) == 0) {
      upb_Message_SetBaseField(msg,f,&ret);
    }
    else {
      if (((ulong)msg->field_0 & 1) != 0) {
        __assert_fail("!upb_Message_IsFrozen(msg)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x145,
                      "_Bool upb_Message_SetExtension(struct upb_Message *, const upb_MiniTableExtension *, const void *, upb_Arena *)"
                     );
      }
      puVar4 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                         (msg,(upb_MiniTableExtension *)f,arena);
      if (puVar4 != (upb_Extension *)0x0) {
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&puVar4->data,&ret);
      }
    }
    if (array != (upb_Array *)0x0) goto LAB_002b8f87;
LAB_002b8fb5:
    pvVar6 = (void *)0x0;
  }
  else {
LAB_002b8f87:
    uVar5 = array->data_dont_copy_me__upb_internal_use_only;
    if ((uVar5 & 4) != 0) {
      __assertion = "!upb_Array_IsFrozen(array)";
      __file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
      ;
      __function = 
      "_Bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
      ;
      __line = 0x6c;
LAB_002b901b:
      __assert_fail(__assertion,__file,__line,__function);
    }
    if (array->capacity_dont_copy_me__upb_internal_use_only < size) {
      _Var2 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(array,size,arena);
      if (!_Var2) goto LAB_002b8fb5;
      uVar5 = array->data_dont_copy_me__upb_internal_use_only;
    }
    array->size_dont_copy_me__upb_internal_use_only = size;
    pvVar6 = (void *)(uVar5 & 0xfffffffffffffff8);
  }
  return pvVar6;
}

Assistant:

UPB_API_INLINE void* upb_Message_ResizeArrayUninitialized(
    struct upb_Message* msg, const upb_MiniTableField* f, size_t size,
    upb_Arena* arena) {
  UPB_PRIVATE(_upb_MiniTableField_CheckIsArray)(f);
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(msg, f, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(arr, size, arena)) {
    return NULL;
  }
  return upb_Array_MutableDataPtr(arr);
}